

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.cpp
# Opt level: O3

void __thiscall cs::statement_if::run_impl(statement_if *this)

{
  context_t *pcVar1;
  bool bVar2;
  element_type *peVar3;
  stack_pointer psVar4;
  _Elt_pointer ppsVar5;
  statement_base *psVar6;
  undefined *puVar7;
  bool *pbVar8;
  _Elt_pointer ppsVar9;
  stack_pointer this_00;
  _Map_pointer pppsVar10;
  _Elt_pointer ppsVar11;
  scope_guard scope;
  scope_guard local_a0;
  slot_type *local_98;
  
  local_98 = (slot_type *)(this->mTree).mRoot;
  runtime_type::parse_expr
            ((runtime_type *)&stack0xffffffffffffff60,
             (iterator *)
             (((this->super_statement_base).context.
               super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->instance).
             super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             SUB81(&stack0xffffffffffffff68,0));
  pbVar8 = cs_impl::any::const_val<bool>((any *)&stack0xffffffffffffff60);
  bVar2 = *pbVar8;
  cs_impl::any::recycle((any *)&stack0xffffffffffffff60);
  if (bVar2 == true) {
    pcVar1 = &(this->super_statement_base).context;
    peVar3 = (((this->super_statement_base).context.
               super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->instance).
             super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    psVar4 = *(peVar3->super_runtime_type).storage.fiber_stack;
    this_00 = &(peVar3->super_runtime_type).storage.m_data;
    if (psVar4 != (stack_pointer)0x0) {
      this_00 = psVar4;
    }
    local_a0.context = pcVar1;
    stack_type<cs::domain_type,_std::allocator>::push<>(this_00);
    ppsVar11 = (this->mBlock).
               super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>.
               _M_impl.super__Deque_impl_data._M_start._M_cur;
    ppsVar5 = (this->mBlock).
              super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl
              .super__Deque_impl_data._M_finish._M_cur;
    if (ppsVar11 != ppsVar5) {
      ppsVar9 = (this->mBlock).
                super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>.
                _M_impl.super__Deque_impl_data._M_start._M_last;
      pppsVar10 = (this->mBlock).
                  super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>.
                  _M_impl.super__Deque_impl_data._M_start._M_node;
      do {
        puVar7 = current_process;
        psVar6 = *ppsVar11;
        if ((*current_process & 1) != 0) {
          LOCK();
          *current_process = 0;
          UNLOCK();
          event_type::touch((event_type *)(puVar7 + 0xd0),(void *)0x0);
        }
        (*psVar6->_vptr_statement_base[3])(psVar6);
        peVar3 = (((pcVar1->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                  )->instance).super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        if (((peVar3->return_fcall != false) || (peVar3->break_block != false)) ||
           (peVar3->continue_block != false)) break;
        ppsVar11 = ppsVar11 + 1;
        if (ppsVar11 == ppsVar9) {
          ppsVar11 = pppsVar10[1];
          pppsVar10 = pppsVar10 + 1;
          ppsVar9 = ppsVar11 + 0x40;
        }
      } while (ppsVar11 != ppsVar5);
    }
    scope_guard::~scope_guard(&stack0xffffffffffffff60);
  }
  return;
}

Assistant:

void statement_if::run_impl()
	{
		CS_DEBUGGER_STEP(this);
		if (context->instance->parse_expr(mTree.root()).const_val<boolean>()) {
			scope_guard scope(context);
			for (auto &ptr: mBlock) {
				try {
					ptr->run();
				}
				catch (const cs::exception &e) {
					throw e;
				}
				catch (const std::exception &e) {
					throw exception(ptr->get_line_num(), ptr->get_file_path(), ptr->get_raw_code(), e.what());
				}
				if (context->instance->return_fcall || context->instance->break_block ||
				        context->instance->continue_block)
					break;
			}
		}
	}